

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

MOJOSHADER_glEffect * MOJOSHADER_glCompileEffect(MOJOSHADER_effect *effect)

{
  GLuint GVar1;
  MOJOSHADER_malloc p_Var2;
  MOJOSHADER_free p_Var3;
  void *pvVar4;
  MOJOSHADER_effectObject *pMVar5;
  int iVar6;
  MOJOSHADER_glEffect *pMVar7;
  ulong uVar8;
  MOJOSHADER_glShader *pMVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  GLuint shader;
  void *local_48;
  MOJOSHADER_free local_40;
  ulong local_38;
  
  p_Var2 = effect->malloc;
  p_Var3 = effect->free;
  pvVar4 = effect->malloc_data;
  shader = 0;
  pMVar7 = (MOJOSHADER_glEffect *)(*p_Var2)(0x58,pvVar4);
  if (pMVar7 != (MOJOSHADER_glEffect *)0x0) {
    pMVar7->current_vert_raw = (MOJOSHADER_effectShader *)0x0;
    pMVar7->current_frag_raw = (MOJOSHADER_effectShader *)0x0;
    pMVar7->current_vert = (MOJOSHADER_glShader *)0x0;
    pMVar7->current_frag = (MOJOSHADER_glShader *)0x0;
    *(undefined8 *)&pMVar7->num_preshaders = 0;
    pMVar7->preshader_indices = (uint *)0x0;
    pMVar7->shaders = (MOJOSHADER_glShader *)0x0;
    pMVar7->shader_indices = (uint *)0x0;
    pMVar7->effect = (MOJOSHADER_effect *)0x0;
    *(undefined8 *)&pMVar7->num_shaders = 0;
    pMVar7->prev_program = (MOJOSHADER_glProgram *)0x0;
    uVar8 = 0;
    uVar16 = (ulong)(uint)effect->object_count;
    if (effect->object_count < 1) {
      uVar16 = uVar8;
    }
    uVar11 = 0;
    uVar12 = 0;
    for (; uVar16 * 0x48 - uVar8 != 0; uVar8 = uVar8 + 0x48) {
      if (*(int *)((long)effect->objects + uVar8) - 0xfU < 2) {
        if (*(int *)((long)effect->objects + uVar8 + 0xc) == 0) {
          uVar12 = uVar12 + 1;
          pMVar7->num_shaders = uVar12;
        }
        else {
          uVar11 = uVar11 + 1;
          pMVar7->num_preshaders = uVar11;
        }
      }
    }
    pMVar9 = (MOJOSHADER_glShader *)(*p_Var2)(uVar12 << 4,pvVar4);
    pMVar7->shaders = pMVar9;
    if (pMVar9 != (MOJOSHADER_glShader *)0x0) {
      memset(pMVar9,0,(ulong)pMVar7->num_shaders << 4);
      puVar10 = (uint *)(*p_Var2)(pMVar7->num_shaders << 2,pvVar4);
      pMVar7->shader_indices = puVar10;
      if (puVar10 == (uint *)0x0) {
        pMVar9 = pMVar7->shaders;
      }
      else {
        memset(puVar10,0,(ulong)pMVar7->num_shaders << 2);
        if (pMVar7->num_preshaders == 0) {
LAB_0010c2a0:
          lVar14 = 0x40;
          lVar13 = 0;
          iVar15 = 0;
          local_38 = 0;
          local_48 = pvVar4;
          local_40 = p_Var3;
          do {
            if (effect->object_count <= lVar13) {
              pMVar7->effect = effect;
              return pMVar7;
            }
            pMVar5 = effect->objects;
            if (*(int *)((long)pMVar5 + lVar14 + -0x40) - 0xfU < 2) {
              if (*(int *)((long)pMVar5 + lVar14 + -0x34) == 0) {
                iVar6 = (*ctx->profileCompileShader)
                                  (*(MOJOSHADER_parseData **)((long)pMVar5 + lVar14),&shader);
                pvVar4 = local_48;
                if (iVar6 == 0) {
                  lVar14 = 8;
                  for (uVar16 = 0; p_Var3 = local_40, uVar16 < pMVar7->num_shaders;
                      uVar16 = uVar16 + 1) {
                    GVar1 = *(GLuint *)((long)&pMVar7->shaders->parseData + lVar14);
                    if (GVar1 != 0) {
                      (*ctx->profileDeleteShader)(GVar1);
                    }
                    lVar14 = lVar14 + 0x10;
                  }
                  (*local_40)(pMVar7->shader_indices,pvVar4);
                  (*p_Var3)(pMVar7->shaders,pvVar4);
                  (*p_Var3)(pMVar7,pvVar4);
                  return (MOJOSHADER_glEffect *)0x0;
                }
                pMVar9 = pMVar7->shaders;
                pMVar9[iVar15].parseData = *(MOJOSHADER_parseData **)((long)pMVar5 + lVar14);
                pMVar9[iVar15].handle = shader;
                pMVar9[iVar15].refcount = 1;
                pMVar7->shader_indices[iVar15] = (uint)lVar13;
                iVar15 = iVar15 + 1;
              }
              else {
                iVar6 = (int)local_38;
                local_38 = (ulong)(iVar6 + 1);
                pMVar7->preshader_indices[iVar6] = (uint)lVar13;
              }
            }
            lVar13 = lVar13 + 1;
            lVar14 = lVar14 + 0x48;
          } while( true );
        }
        puVar10 = (uint *)(*p_Var2)(pMVar7->num_preshaders << 2,pvVar4);
        pMVar7->preshader_indices = puVar10;
        if (puVar10 != (uint *)0x0) {
          memset(puVar10,0,(ulong)pMVar7->num_preshaders << 2);
          goto LAB_0010c2a0;
        }
        (*p_Var3)(pMVar7->shaders,pvVar4);
        pMVar9 = (MOJOSHADER_glShader *)pMVar7->shader_indices;
      }
      (*p_Var3)(pMVar9,pvVar4);
    }
    (*p_Var3)(pMVar7,pvVar4);
  }
  out_of_memory();
  return (MOJOSHADER_glEffect *)0x0;
}

Assistant:

MOJOSHADER_glEffect *MOJOSHADER_glCompileEffect(MOJOSHADER_effect *effect)
{
    int i;
    MOJOSHADER_malloc m = effect->malloc;
    MOJOSHADER_free f = effect->free;
    void *d = effect->malloc_data;
    int current_shader = 0;
    int current_preshader = 0;
    GLuint shader = 0;

    MOJOSHADER_glEffect *retval = (MOJOSHADER_glEffect *) m(sizeof (MOJOSHADER_glEffect), d);
    if (retval == NULL)
    {
        out_of_memory();
        return NULL;
    } // if
    memset(retval, '\0', sizeof (MOJOSHADER_glEffect));

    // Count the number of shaders before allocating
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
                retval->num_preshaders++;
            else
                retval->num_shaders++;
        } // if
    } // for

    // Alloc shader information
    retval->shaders = (MOJOSHADER_glShader *) m(retval->num_shaders * sizeof (MOJOSHADER_glShader), d);
    if (retval->shaders == NULL)
    {
        f(retval, d);
        out_of_memory();
        return NULL;
    } // if
    memset(retval->shaders, '\0', retval->num_shaders * sizeof (MOJOSHADER_glShader));
    retval->shader_indices = (unsigned int *) m(retval->num_shaders * sizeof (unsigned int), d);
    if (retval->shader_indices == NULL)
    {
        f(retval->shaders, d);
        f(retval, d);
        out_of_memory();
        return NULL;
    } // if
    memset(retval->shader_indices, '\0', retval->num_shaders * sizeof (unsigned int));

    // Alloc preshader information
    if (retval->num_preshaders > 0)
    {
        retval->preshader_indices = (unsigned int *) m(retval->num_preshaders * sizeof (unsigned int), d);
        if (retval->preshader_indices == NULL)
        {
            f(retval->shaders, d);
            f(retval->shader_indices, d);
            f(retval, d);
            out_of_memory();
            return NULL;
        } // if
        memset(retval->preshader_indices, '\0', retval->num_preshaders * sizeof (unsigned int));
    } // if

    // Run through the shaders again, compiling and tracking the object indices
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
            {
                retval->preshader_indices[current_preshader++] = i;
                continue;
            } // if
            if (!ctx->profileCompileShader(object->shader.shader, &shader))
                goto compile_shader_fail;
            retval->shaders[current_shader].parseData = object->shader.shader;
            retval->shaders[current_shader].handle = shader;
            retval->shaders[current_shader].refcount = 1;
            retval->shader_indices[current_shader] = i;
            current_shader++;
        } // if
    } // for

    retval->effect = effect;
    return retval;

compile_shader_fail:
    for (i = 0; i < retval->num_shaders; i++)
        if (retval->shaders[i].handle != 0)
            ctx->profileDeleteShader(retval->shaders[i].handle);
    f(retval->shader_indices, d);
    f(retval->shaders, d);
    f(retval, d);
    return NULL;
}